

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O1

void __thiscall
duckdb::roaring::ContainerMetadataCollection::AddMetadata
          (ContainerMetadataCollection *this,ContainerMetadata metadata)

{
  bool is_inverted;
  
  if (metadata.container_type == BITSET_CONTAINER) {
    AddBitsetContainer(this);
    return;
  }
  is_inverted = (bool)(metadata.nulls & 1);
  if (((uint)metadata & 0xff) == 0) {
    AddRunContainer(this,(ulong)((uint)metadata >> 0x10),is_inverted);
    return;
  }
  AddArrayContainer(this,(ulong)((uint)metadata >> 0x10),is_inverted);
  return;
}

Assistant:

void ContainerMetadataCollection::AddMetadata(ContainerMetadata metadata) {
	if (metadata.IsRun()) {
		AddRunContainer(metadata.NumberOfRuns(), metadata.IsInverted());
	} else if (metadata.IsUncompressed()) {
		AddBitsetContainer();
	} else {
		AddArrayContainer(metadata.Cardinality(), metadata.IsInverted());
	}
}